

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::SPxLPBase<double>::changeElement(SPxLPBase<double> *this,int i,int j,double *val,bool scale)

{
  uint uVar1;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Nonzero<double> *pNVar2;
  Nonzero<double> *pNVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  int *piVar8;
  Item *pIVar9;
  Item *pIVar10;
  bool bVar11;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar13;
  Real RVar14;
  uint local_58;
  int local_54;
  double local_50;
  double local_48;
  ulong uStack_40;
  Real local_38;
  
  if ((j | i) < 0) {
    return;
  }
  pIVar10 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
            (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[i].idx;
  pIVar9 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
           (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[j].idx;
  local_48 = *val;
  uStack_40 = 0;
  this_00 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  this_01 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_58 = i;
  local_54 = j;
  RVar14 = Tolerances::epsilon(this_00);
  local_48 = ABS(local_48);
  uStack_40 = uStack_40 & 0x7fffffffffffffff;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_38 = RVar14;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    RVar14 = local_38;
  }
  if (local_48 <= RVar14) {
    pNVar2 = (pIVar10->data).super_SVectorBase<double>.m_elem;
    if ((pNVar2 == (Nonzero<double> *)0x0) ||
       (uVar7 = (ulong)(pIVar10->data).super_SVectorBase<double>.memused, (long)uVar7 < 1)) {
LAB_001e9799:
      iVar6 = -1;
    }
    else {
      if (pNVar2->idx == local_54) {
        bVar11 = true;
        uVar4 = 0;
      }
      else {
        uVar4 = 0;
        piVar8 = &pNVar2[1].idx;
        do {
          if (uVar7 - 1 == uVar4) goto LAB_001e9799;
          uVar4 = uVar4 + 1;
          iVar6 = *piVar8;
          piVar8 = piVar8 + 4;
        } while (iVar6 != local_54);
        bVar11 = uVar4 < uVar7;
      }
      iVar6 = (int)uVar4;
      if (!bVar11) goto LAB_001e9799;
    }
    if (iVar6 < 0) {
      return;
    }
    pNVar3 = (pIVar9->data).super_SVectorBase<double>.m_elem;
    if ((pNVar3 == (Nonzero<double> *)0x0) ||
       (uVar7 = (ulong)(pIVar9->data).super_SVectorBase<double>.memused, (long)uVar7 < 1)) {
LAB_001e9861:
      iVar6 = -1;
    }
    else {
      if (pNVar3->idx == local_58) {
        bVar11 = true;
        uVar4 = 0;
      }
      else {
        uVar4 = 0;
        piVar8 = &pNVar3[1].idx;
        do {
          if (uVar7 - 1 == uVar4) goto LAB_001e9861;
          uVar4 = uVar4 + 1;
          uVar1 = *piVar8;
          piVar8 = piVar8 + 4;
        } while (uVar1 != local_58);
        bVar11 = uVar4 < uVar7;
      }
      iVar6 = (int)uVar4;
      if (!bVar11) goto LAB_001e9861;
    }
    if (iVar6 < 0) {
      return;
    }
    if ((pNVar2 == (Nonzero<double> *)0x0) ||
       (uVar7 = (ulong)(pIVar10->data).super_SVectorBase<double>.memused, (long)uVar7 < 1)) {
LAB_001e998c:
      iVar6 = -1;
    }
    else {
      if (pNVar2->idx == local_54) {
        bVar11 = true;
        uVar4 = 0;
      }
      else {
        uVar4 = 0;
        piVar8 = &pNVar2[1].idx;
        do {
          if (uVar7 - 1 == uVar4) goto LAB_001e998c;
          uVar4 = uVar4 + 1;
          iVar6 = *piVar8;
          piVar8 = piVar8 + 4;
        } while (iVar6 != local_54);
        bVar11 = uVar4 < uVar7;
      }
      iVar6 = (int)uVar4;
      if (!bVar11) goto LAB_001e998c;
    }
    lVar5 = (long)(pIVar10->data).super_SVectorBase<double>.memused + -1;
    (pIVar10->data).super_SVectorBase<double>.memused = (int)lVar5;
    if (iVar6 < (int)lVar5) {
      pNVar2[iVar6].idx = pNVar2[lVar5].idx;
      pNVar2[iVar6].val = pNVar2[lVar5].val;
    }
    pNVar2 = (pIVar9->data).super_SVectorBase<double>.m_elem;
    if ((pNVar2 != (Nonzero<double> *)0x0) &&
       (uVar7 = (ulong)(pIVar9->data).super_SVectorBase<double>.memused, 0 < (long)uVar7)) {
      if (pNVar2->idx == local_58) {
        bVar11 = true;
        uVar4 = 0;
      }
      else {
        uVar4 = 0;
        piVar8 = &pNVar2[1].idx;
        do {
          if (uVar7 - 1 == uVar4) goto LAB_001e9a74;
          uVar4 = uVar4 + 1;
          uVar1 = *piVar8;
          piVar8 = piVar8 + 4;
        } while (uVar1 != local_58);
        bVar11 = uVar4 < uVar7;
      }
      iVar6 = (int)uVar4;
      if (bVar11) goto LAB_001e9a79;
    }
LAB_001e9a74:
    iVar6 = -1;
LAB_001e9a79:
    lVar5 = (long)(pIVar9->data).super_SVectorBase<double>.memused + -1;
    (pIVar9->data).super_SVectorBase<double>.memused = (int)lVar5;
    if ((int)lVar5 <= iVar6) {
      return;
    }
    pNVar2[iVar6].idx = pNVar2[lVar5].idx;
    pNVar2[iVar6].val = pNVar2[lVar5].val;
    return;
  }
  if (scale) {
    (*this->lp_scaler->_vptr_SPxScaler[0x2a])(SUB84(*val,0),this->lp_scaler,this,(ulong)local_58);
    uVar12 = extraout_XMM0_Da;
    uVar13 = extraout_XMM0_Db;
  }
  else {
    uVar12 = SUB84(*val,0);
    uVar13 = (undefined4)((ulong)*val >> 0x20);
  }
  local_50 = (double)CONCAT44(uVar13,uVar12);
  pNVar2 = (pIVar10->data).super_SVectorBase<double>.m_elem;
  if ((pNVar2 == (Nonzero<double> *)0x0) ||
     (uVar7 = (ulong)(pIVar10->data).super_SVectorBase<double>.memused, (long)uVar7 < 1)) {
LAB_001e97fd:
    iVar6 = -1;
  }
  else {
    if (pNVar2->idx == local_54) {
      bVar11 = true;
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      piVar8 = &pNVar2[1].idx;
      do {
        if (uVar7 - 1 == uVar4) goto LAB_001e97fd;
        uVar4 = uVar4 + 1;
        iVar6 = *piVar8;
        piVar8 = piVar8 + 4;
      } while (iVar6 != local_54);
      bVar11 = uVar4 < uVar7;
    }
    iVar6 = (int)uVar4;
    if (!bVar11) goto LAB_001e97fd;
  }
  if (iVar6 < 0) goto LAB_001e98f2;
  pNVar3 = (pIVar9->data).super_SVectorBase<double>.m_elem;
  if ((pNVar3 == (Nonzero<double> *)0x0) ||
     (uVar7 = (ulong)(pIVar9->data).super_SVectorBase<double>.memused, (long)uVar7 < 1)) {
LAB_001e98c0:
    iVar6 = -1;
  }
  else {
    if (pNVar3->idx == local_58) {
      bVar11 = true;
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      piVar8 = &pNVar3[1].idx;
      do {
        if (uVar7 - 1 == uVar4) goto LAB_001e98c0;
        uVar4 = uVar4 + 1;
        uVar1 = *piVar8;
        piVar8 = piVar8 + 4;
      } while (uVar1 != local_58);
      bVar11 = uVar4 < uVar7;
    }
    iVar6 = (int)uVar4;
    if (!bVar11) goto LAB_001e98c0;
  }
  if (iVar6 < 0) {
LAB_001e98f2:
    SVSetBase<double>::add2
              ((SVSetBase<double> *)this,
               (SVectorBase<double> *)
               ((this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
               (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[(int)local_58].
               idx),1,&local_54,&local_50);
    SVSetBase<double>::add2
              (&(this->super_LPColSetBase<double>).super_SVSetBase<double>,
               (SVectorBase<double> *)
               ((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
               (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[local_54].idx),
               1,(int *)&local_58,&local_50);
    return;
  }
  if ((pNVar2 == (Nonzero<double> *)0x0) ||
     (uVar7 = (ulong)(pIVar10->data).super_SVectorBase<double>.memused, (long)uVar7 < 1)) {
LAB_001e9a11:
    iVar6 = -1;
  }
  else {
    if (pNVar2->idx == local_54) {
      bVar11 = true;
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      piVar8 = &pNVar2[1].idx;
      do {
        if (uVar7 - 1 == uVar4) goto LAB_001e9a11;
        uVar4 = uVar4 + 1;
        iVar6 = *piVar8;
        piVar8 = piVar8 + 4;
      } while (iVar6 != local_54);
      bVar11 = uVar4 < uVar7;
    }
    iVar6 = (int)uVar4;
    if (!bVar11) goto LAB_001e9a11;
  }
  pNVar2[iVar6].val = (double)CONCAT44(uVar13,uVar12);
  if ((pNVar3 != (Nonzero<double> *)0x0) &&
     (uVar7 = (ulong)(pIVar9->data).super_SVectorBase<double>.memused, 0 < (long)uVar7)) {
    if (pNVar3->idx == local_58) {
      bVar11 = true;
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      piVar8 = &pNVar3[1].idx;
      do {
        if (uVar7 - 1 == uVar4) goto LAB_001e9acf;
        uVar4 = uVar4 + 1;
        uVar1 = *piVar8;
        piVar8 = piVar8 + 4;
      } while (uVar1 != local_58);
      bVar11 = uVar4 < uVar7;
    }
    iVar6 = (int)uVar4;
    if (bVar11) goto LAB_001e9ad6;
  }
LAB_001e9acf:
  iVar6 = -1;
LAB_001e9ad6:
  pNVar3[iVar6].val = local_50;
  return;
}

Assistant:

virtual void changeElement(int i, int j, const R& val, bool scale = false)
   {
      if(i < 0 || j < 0)
         return;

      SVectorBase<R>& row = rowVector_w(i);
      SVectorBase<R>& col = colVector_w(j);

      if(isNotZero(val, this->tolerances()->epsilon()))
      {
         R newVal;

         if(scale)
         {
            assert(_isScaled);
            assert(lp_scaler);
            newVal = lp_scaler->scaleElement(*this, i, j, val);
         }
         else
            newVal = val;

         if(row.pos(j) >= 0 && col.pos(i) >= 0)
         {
            row.value(row.pos(j)) = newVal;
            col.value(col.pos(i)) = newVal;
         }
         else
         {
            LPRowSetBase<R>::add2(i, 1, &j, &newVal);
            LPColSetBase<R>::add2(j, 1, &i, &newVal);
         }
      }
      else if(row.pos(j) >= 0 && col.pos(i) >= 0)
      {
         row.remove(row.pos(j));
         col.remove(col.pos(i));
      }

      assert(isConsistent());
   }